

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc2c.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  string *this;
  char *__s;
  long lVar5;
  long lVar6;
  bool bVar7;
  int num_output_order;
  int num_input_order;
  vector<double,_std::allocator<double>_> cepstrum;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  ostringstream error_message_4;
  LinearPredictiveCoefficientsToCepstrum linear_predictive_coefficients_to_cepstrum;
  ifstream ifs;
  int local_420;
  int local_41c;
  string local_418;
  vector<double,_std::allocator<double>_> local_3f8;
  vector<double,_std::allocator<double>_> local_3e0;
  string local_3c8 [3];
  ios_base local_358 [264];
  LinearPredictiveCoefficientsToCepstrum local_250;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_41c = 0x19;
  local_420 = 0x19;
  do {
    while (iVar3 = ya_getopt_long(argc,argv,"m:M:h",(option *)0x0,(int *)0x0), 0x67 < iVar3) {
      if (iVar3 != 0x6d) {
        if (iVar3 == 0x68) {
          anon_unknown.dwarf_2baf::PrintUsage((ostream *)&std::cout);
          return 0;
        }
        goto LAB_001028cd;
      }
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3c8);
      bVar1 = sptk::ConvertStringToInteger(&local_238,&local_41c);
      bVar7 = local_41c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar1 || bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"lpc2c","");
        sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
LAB_00102a6e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8[0]._M_dataplus._M_p != &local_3c8[0].field_2) {
          operator_delete(local_3c8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        return 1;
      }
    }
    if (iVar3 != 0x4d) {
      if (iVar3 != -1) {
LAB_001028cd:
        anon_unknown.dwarf_2baf::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"lpc2c","");
        sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
        goto LAB_00102a6e;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = &local_238;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"lpc2c","");
        sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
        goto LAB_00102a6e;
      }
      std::ifstream::ifstream(this);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (string *)&std::cin;
        }
        sptk::LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
                  (&local_250,local_41c,local_420);
        if (local_250.is_valid_ != false) {
          lVar5 = (long)local_41c;
          lVar6 = (long)local_420;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3e0,lVar5 + 1U,(allocator_type *)local_3c8);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3f8,lVar6 + 1U,(allocator_type *)local_3c8);
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3c8,
                   "Failed to initialize LinearPredictiveCoefficientsToCepstrum",0x3b);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"lpc2c","");
        sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3c8,"Cannot open file ",0x11);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,__s,sVar4);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"lpc2c","");
        sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
      std::ios_base::~ios_base(local_358);
      iVar3 = 1;
      goto LAB_00102d10;
    }
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3c8);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_420);
    bVar7 = local_420 < 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -M option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"lpc2c","");
      sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
      goto LAB_00102a6e;
    }
  } while( true );
LAB_00102b38:
  bVar1 = sptk::ReadStream<double>
                    (false,0,0,(int)(lVar5 + 1U),&local_3e0,(istream *)this,(int *)0x0);
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00102cf2;
  }
  bVar1 = sptk::LinearPredictiveCoefficientsToCepstrum::Run(&local_250,&local_3e0,&local_3f8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3c8,"Failed to convert linear predictive coefficients to cepstrum",
               0x3c);
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"lpc2c","");
    sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
    goto LAB_00102cc0;
  }
  bVar1 = sptk::WriteStream<double>(0,(int)(lVar6 + 1U),&local_3f8,(ostream *)&std::cout,(int *)0x0)
  ;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3c8,"Failed to write cepstrum",0x18);
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"lpc2c","");
    sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
LAB_00102cc0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
    std::ios_base::~ios_base(local_358);
    iVar3 = 1;
LAB_00102cf2:
    if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_00102d10:
    std::ifstream::~ifstream(&local_238);
    return iVar3;
  }
  goto LAB_00102b38;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsToCepstrum
      linear_predictive_coefficients_to_cepstrum(num_input_order,
                                                 num_output_order);
  if (!linear_predictive_coefficients_to_cepstrum.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsToCepstrum";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> linear_predictive_coefficients(input_length);
  std::vector<double> cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length,
                          &linear_predictive_coefficients, &input_stream,
                          NULL)) {
    if (!linear_predictive_coefficients_to_cepstrum.Run(
            linear_predictive_coefficients, &cepstrum)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert linear predictive coefficients to cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }

  return 0;
}